

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

FFSContext create_FFSContext_FM(FMContext_conflict fmc)

{
  FFSContext p_Var1;
  
  p_Var1 = (FFSContext)ffs_malloc(0x30);
  init_float_formats();
  if (fmc == (FMContext_conflict)0x0) {
    fmc = create_FMcontext();
  }
  else {
    add_ref_FMcontext(fmc);
  }
  p_Var1->fmc = fmc;
  p_Var1->handle_list = (FFSTypeHandle_conflict *)0x0;
  (p_Var1->tmp).tmp_buffer = (void *)0x0;
  (p_Var1->tmp).tmp_buffer_size = 0;
  *(undefined8 *)((long)&(p_Var1->tmp).tmp_buffer_size + 4) = 0;
  *(undefined8 *)((long)&(p_Var1->tmp).tmp_buffer_in_use_size + 4) = 0;
  return p_Var1;
}

Assistant:

extern
FFSContext
create_FFSContext_FM(FMContext fmc)
{
    FFSContext c;
    c = (FFSContext) malloc((size_t) sizeof(*c));
    init_float_formats();
    if (fmc == NULL) {
        fmc = create_FMcontext();
    } else {
        add_ref_FMcontext(fmc);
    }
    c->fmc = fmc;
    c->handle_list_size = 0;
    c->handle_list = NULL;
    c->tmp.tmp_buffer = NULL;
    c->tmp.tmp_buffer_size = 0;
    c->tmp.tmp_buffer_in_use_size = 0;

    return c;
}